

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O0

QDateTime * __thiscall QAsn1Element::toDateTime(QAsn1Element *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  char cVar1;
  bool bVar2;
  qsizetype qVar3;
  QStringView *this_00;
  ulong uVar4;
  QDateTime *this_01;
  char *in_RSI;
  QDateTime *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar5;
  int rfc2459CenturyStart;
  QDateTime *result;
  size_t RuntimeThreshold_1;
  size_t RuntimeThreshold;
  size_t i;
  size_t i_1;
  size_t RuntimeThreshold_2;
  size_t i_2;
  QTime time;
  QDate date;
  QLatin1StringView inputView;
  QLatin1String *in_stack_fffffffffffffe08;
  QDateTime *other;
  QDateTime *in_stack_fffffffffffffe10;
  QByteArray *in_stack_fffffffffffffe18;
  QStringView *str;
  QStringView *in_stack_fffffffffffffe20;
  ulong local_120;
  ulong local_108;
  ulong local_e0;
  storage_type_conflict *local_c8;
  int local_c0;
  undefined1 local_b8 [24];
  QDateTime local_a0 [8];
  QTimeZone local_98;
  undefined4 local_8c;
  undefined8 local_88;
  QDateTime local_80 [8];
  QStringView local_78;
  undefined1 local_68 [28];
  undefined4 local_4c;
  QStringView local_48;
  undefined1 local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  QDateTime::QDateTime(in_RDI);
  qVar3 = QByteArray::size((QByteArray *)(in_RSI + 8));
  if ((qVar3 == 0xd) || (qVar3 = QByteArray::size((QByteArray *)(in_RSI + 8)), qVar3 == 0xf)) {
    cVar1 = QByteArray::operator[]((QByteArray *)in_stack_fffffffffffffe08,0x11b2e0);
    bVar2 = QtMiscUtils::isAsciiDigit((int)cVar1);
    if ((bVar2) && (cVar1 = QByteArray::back((QByteArray *)in_stack_fffffffffffffe10), cVar1 == 'Z')
       ) {
      if ((*in_RSI == '\x17') &&
         (qVar3 = QByteArray::size((QByteArray *)(in_RSI + 8)), qVar3 == 0xd)) {
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        QLatin1String::QLatin1String
                  ((QLatin1String *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_20 = 0xaaaaaaaaaaaaaaaa;
        QLatin1String::first(in_stack_fffffffffffffe08,0x11b3ac);
        latin1.m_data = in_RSI;
        latin1.m_size = (qsizetype)in_RDI;
        QString::QString((QString *)in_stack_fffffffffffffe20,latin1);
        std::data<char16_t_const,7ul>((char16_t (*) [7])L"yyMMdd");
        for (local_120 = 0; (local_120 < 7 && (L"yyMMdd"[local_120] != L'\0'));
            local_120 = local_120 + 1) {
        }
        QStringView::QStringView<char16_t,_true>
                  (in_stack_fffffffffffffe20,(char16_t *)in_stack_fffffffffffffe18,
                   (qsizetype)in_stack_fffffffffffffe10);
        local_20 = QDate::fromString((QString *)local_38,local_48,0x79e);
        QString::~QString((QString *)0x11b4e9);
        bVar2 = QDate::isValid((QDate *)in_stack_fffffffffffffe20);
        if (bVar2) {
          local_4c = 0xaaaaaaaa;
          QLatin1String::sliced
                    ((QLatin1String *)in_stack_fffffffffffffe20,(qsizetype)in_stack_fffffffffffffe18
                     ,(qsizetype)in_stack_fffffffffffffe10);
          latin1_00.m_data = in_RSI;
          latin1_00.m_size = (qsizetype)in_RDI;
          QString::QString((QString *)in_stack_fffffffffffffe20,latin1_00);
          str = &local_78;
          this_00 = (QStringView *)std::data<char16_t_const,7ul>((char16_t (*) [7])L"HHmmss");
          for (local_108 = 0; (local_108 < 7 && (L"HHmmss"[local_108] != L'\0'));
              local_108 = local_108 + 1) {
          }
          QStringView::QStringView<char16_t,_true>
                    (this_00,(char16_t *)str,(qsizetype)in_stack_fffffffffffffe10);
          local_4c = QTime::fromString((QString *)local_68,local_78);
          QString::~QString((QString *)0x11b665);
          uVar4 = QTime::isValid();
          if ((uVar4 & 1) != 0) {
            local_88 = local_20;
            local_8c = local_4c;
            QTimeZone::QTimeZone
                      ((QTimeZone *)in_stack_fffffffffffffe10,
                       (Initialization)((ulong)in_stack_fffffffffffffe08 >> 0x20));
            QDateTime::QDateTime(local_80,local_88,local_8c,&local_98,1);
            QDateTime::operator=(in_stack_fffffffffffffe10,(QDateTime *)in_stack_fffffffffffffe08);
            QDateTime::~QDateTime(local_80);
            QTimeZone::~QTimeZone(&local_98);
          }
        }
      }
      else if ((*in_RSI == '\x18') &&
              (qVar3 = QByteArray::size((QByteArray *)(in_RSI + 8)), qVar3 == 0xf)) {
        QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffe10);
        other = (QDateTime *)&local_c8;
        this_01 = (QDateTime *)std::data<char16_t_const,16ul>((char16_t (*) [16])L"yyyyMMddHHmmsst")
        ;
        for (local_e0 = 0; (local_e0 < 0x10 && (L"yyyyMMddHHmmsst"[local_e0] != L'\0'));
            local_e0 = local_e0 + 1) {
        }
        QStringView::QStringView<char16_t,_true>
                  (in_stack_fffffffffffffe20,(char16_t *)in_stack_fffffffffffffe18,
                   (qsizetype)this_01);
        QVar5.m_data = local_c8;
        QVar5.m_size = (qsizetype)local_b8;
        QDateTime::fromString((QString *)local_a0,QVar5,local_c0);
        QDateTime::operator=(this_01,other);
        QDateTime::~QDateTime(local_a0);
        QString::~QString((QString *)0x11b88c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QAsn1Element::toDateTime() const
{
    QDateTime result;

    if (mValue.size() != 13 && mValue.size() != 15)
        return result;

    // QDateTime::fromString is lenient and accepts +- signs in front
    // of the year; but ASN.1 doesn't allow them.
    if (!isAsciiDigit(mValue[0]))
        return result;

    // Timezone must be present, and UTC
    if (mValue.back() != 'Z')
        return result;

    if (mType == UtcTimeType && mValue.size() == 13) {
        // RFC 2459:
        //   Where YY is greater than or equal to 50, the year shall be
        //   interpreted as 19YY; and
        //
        //   Where YY is less than 50, the year shall be interpreted as 20YY.
        //
        // so use 1950 as base year.
        constexpr int rfc2459CenturyStart = 1950;
        const QLatin1StringView inputView(mValue);
        QDate date = QDate::fromString(inputView.first(6), u"yyMMdd", rfc2459CenturyStart);
        if (!date.isValid())
            return result;

        Q_ASSERT(date.year() >= rfc2459CenturyStart);
        Q_ASSERT(date.year() < 100 + rfc2459CenturyStart);

        QTime time = QTime::fromString(inputView.sliced(6, 6), u"HHmmss");
        if (!time.isValid())
            return result;
        result = QDateTime(date, time, QTimeZone::UTC);
    } else if (mType == GeneralizedTimeType && mValue.size() == 15) {
        result = QDateTime::fromString(QString::fromLatin1(mValue), u"yyyyMMddHHmmsst");
    }

    return result;
}